

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

llama_sampler *
llama_sampler_init_logit_bias(int32_t n_vocab,int32_t n_logit_bias,llama_logit_bias *logit_bias)

{
  int32_t *piVar1;
  llama_sampler *plVar2;
  allocator_type local_21;
  
  piVar1 = (int32_t *)operator_new(0x38);
  *piVar1 = n_vocab;
  std::vector<llama_logit_bias,std::allocator<llama_logit_bias>>::
  vector<llama_logit_bias_const*,void>
            ((vector<llama_logit_bias,std::allocator<llama_logit_bias>> *)(piVar1 + 2),logit_bias,
             logit_bias + n_logit_bias,&local_21);
  piVar1[8] = 0;
  piVar1[9] = 0;
  piVar1[10] = 0;
  piVar1[0xb] = 0;
  piVar1[0xc] = 0;
  piVar1[0xd] = 0;
  plVar2 = (llama_sampler *)operator_new(0x10);
  plVar2->iface = &llama_sampler_logit_bias_i;
  plVar2->ctx = piVar1;
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_logit_bias(
                         int32_t   n_vocab,
                         int32_t   n_logit_bias,
          const llama_logit_bias * logit_bias) {
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_logit_bias_i,
        /* .ctx   = */ new llama_sampler_logit_bias {
            /* .n_vocab    = */ n_vocab,
            /* .logit_bias = */ std::vector<llama_logit_bias>(logit_bias, logit_bias + n_logit_bias),
            /* .to_search  = */ {},
        }
    );
}